

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O1

unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true> __thiscall
duckdb::
PropagateNumericStats<duckdb::TrySubtractOperator,duckdb::SubtractPropagateStatistics,duckdb::SubtractOperator>
          (duckdb *this,ClientContext *context,FunctionStatisticsInput *input)

{
  LogicalType *pLVar1;
  BoundFunctionExpression *pBVar2;
  vector<duckdb::BaseStatistics,_true> *this_00;
  bool bVar3;
  uint uVar4;
  reference stats;
  reference stats_00;
  BaseStatistics result;
  Value new_max;
  Value new_min;
  LogicalType local_180;
  LogicalType local_168;
  LogicalType local_150;
  LogicalType local_138;
  BaseStatistics local_120;
  Value local_c8;
  Value local_88;
  LogicalType local_48;
  
  pBVar2 = input->expr;
  this_00 = input->child_stats;
  stats = vector<duckdb::BaseStatistics,_true>::operator[](this_00,0);
  stats_00 = vector<duckdb::BaseStatistics,_true>::operator[](this_00,1);
  LogicalType::LogicalType(&local_48,SQLNULL);
  Value::Value(&local_88,&local_48);
  LogicalType::~LogicalType(&local_48);
  LogicalType::LogicalType(&local_138,SQLNULL);
  Value::Value(&local_c8,&local_138);
  LogicalType::~LogicalType(&local_138);
  bVar3 = NumericStats::HasMinMax(stats);
  if (bVar3) {
    bVar3 = NumericStats::HasMinMax(stats_00);
    if (!bVar3) goto LAB_010702e4;
    uVar4 = (uint)(pBVar2->super_Expression).return_type.physical_type_;
    if (6 < uVar4 - 3) {
switchD_01070268_caseD_4:
      *(undefined8 *)this = 0;
      goto LAB_010703e4;
    }
    pLVar1 = &(pBVar2->super_Expression).return_type;
    switch(uVar4) {
    case 3:
      bVar3 = SubtractPropagateStatistics::Operation<signed_char,duckdb::TrySubtractOperator>
                        (pLVar1,stats,stats_00,&local_88,&local_c8);
      break;
    default:
      goto switchD_01070268_caseD_4;
    case 5:
      bVar3 = SubtractPropagateStatistics::Operation<short,duckdb::TrySubtractOperator>
                        (pLVar1,stats,stats_00,&local_88,&local_c8);
      break;
    case 7:
      bVar3 = SubtractPropagateStatistics::Operation<int,duckdb::TrySubtractOperator>
                        (pLVar1,stats,stats_00,&local_88,&local_c8);
      break;
    case 9:
      bVar3 = SubtractPropagateStatistics::Operation<long,duckdb::TrySubtractOperator>
                        (pLVar1,stats,stats_00,&local_88,&local_c8);
    }
    if (bVar3 != false) goto LAB_010702e4;
    if ((input->bind_data).ptr != (FunctionData *)0x0) {
      optional_ptr<duckdb::FunctionData,_true>::CheckValid(&input->bind_data);
      *(undefined1 *)&(input->bind_data).ptr[1]._vptr_FunctionData = 0;
    }
    GetScalarIntegerFunction<duckdb::SubtractOperator>
              ((scalar_function_t *)&local_120,(pBVar2->super_Expression).return_type.physical_type_
              );
    ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
    operator=(&(pBVar2->function).function,
              (function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
              &local_120);
    if (local_120.type.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      (*(code *)local_120.type.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi)(&local_120,&local_120,3);
    }
  }
  else {
LAB_010702e4:
    pLVar1 = &(pBVar2->super_Expression).return_type;
    LogicalType::LogicalType(&local_150,pLVar1);
    Value::Value((Value *)&local_120,&local_150);
    Value::operator=(&local_88,(Value *)&local_120);
    Value::~Value((Value *)&local_120);
    LogicalType::~LogicalType(&local_150);
    LogicalType::LogicalType(&local_168,pLVar1);
    Value::Value((Value *)&local_120,&local_168);
    Value::operator=(&local_c8,(Value *)&local_120);
    Value::~Value((Value *)&local_120);
    LogicalType::~LogicalType(&local_168);
  }
  LogicalType::LogicalType(&local_180,&(pBVar2->super_Expression).return_type);
  NumericStats::CreateEmpty(&local_120,&local_180);
  LogicalType::~LogicalType(&local_180);
  NumericStats::SetMin(&local_120,&local_88);
  NumericStats::SetMax(&local_120,&local_c8);
  BaseStatistics::CombineValidity(&local_120,stats,stats_00);
  BaseStatistics::ToUnique((BaseStatistics *)this);
  BaseStatistics::~BaseStatistics(&local_120);
LAB_010703e4:
  Value::~Value(&local_c8);
  Value::~Value(&local_88);
  return (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
         (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)this;
}

Assistant:

static unique_ptr<BaseStatistics> PropagateNumericStats(ClientContext &context, FunctionStatisticsInput &input) {
	auto &child_stats = input.child_stats;
	auto &expr = input.expr;
	D_ASSERT(child_stats.size() == 2);
	// can only propagate stats if the children have stats
	auto &lstats = child_stats[0];
	auto &rstats = child_stats[1];
	Value new_min, new_max;
	bool potential_overflow = true;
	if (NumericStats::HasMinMax(lstats) && NumericStats::HasMinMax(rstats)) {
		switch (expr.return_type.InternalType()) {
		case PhysicalType::INT8:
			potential_overflow =
			    PROPAGATE::template Operation<int8_t, OP>(expr.return_type, lstats, rstats, new_min, new_max);
			break;
		case PhysicalType::INT16:
			potential_overflow =
			    PROPAGATE::template Operation<int16_t, OP>(expr.return_type, lstats, rstats, new_min, new_max);
			break;
		case PhysicalType::INT32:
			potential_overflow =
			    PROPAGATE::template Operation<int32_t, OP>(expr.return_type, lstats, rstats, new_min, new_max);
			break;
		case PhysicalType::INT64:
			potential_overflow =
			    PROPAGATE::template Operation<int64_t, OP>(expr.return_type, lstats, rstats, new_min, new_max);
			break;
		default:
			return nullptr;
		}
	}
	if (potential_overflow) {
		new_min = Value(expr.return_type);
		new_max = Value(expr.return_type);
	} else {
		// no potential overflow: replace with non-overflowing operator
		if (input.bind_data) {
			auto &bind_data = input.bind_data->Cast<DecimalArithmeticBindData>();
			bind_data.check_overflow = false;
		}
		expr.function.function = GetScalarIntegerFunction<BASEOP>(expr.return_type.InternalType());
	}
	auto result = NumericStats::CreateEmpty(expr.return_type);
	NumericStats::SetMin(result, new_min);
	NumericStats::SetMax(result, new_max);
	result.CombineValidity(lstats, rstats);
	return result.ToUnique();
}